

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O1

void nsvg__initPaint(NSVGcachedPaint *cache,NSVGpaint *paint,float opacity)

{
  float fVar1;
  char cVar2;
  uint uVar3;
  NSVGgradient *pNVar4;
  undefined8 uVar5;
  int iu;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iu_1;
  
  cVar2 = paint->type;
  cache->type = cVar2;
  if (cVar2 == '\x01') {
    fVar17 = 1.0;
    if (opacity <= 1.0) {
      fVar17 = opacity;
    }
    cache->colors[0] =
         ((paint->field_1).color >> 8 & 0xff0000) *
         (int)(float)(~-(uint)(opacity < 0.0) & (uint)(fVar17 * 256.0)) & 0xff000000 |
         (paint->field_1).color & 0xffffff;
  }
  else {
    pNVar4 = (paint->field_1).gradient;
    cache->spread = pNVar4->spread;
    *(undefined8 *)(cache->xform + 4) = *(undefined8 *)(pNVar4->xform + 4);
    uVar5 = *(undefined8 *)(pNVar4->xform + 2);
    *(undefined8 *)cache->xform = *(undefined8 *)pNVar4->xform;
    *(undefined8 *)(cache->xform + 2) = uVar5;
    if (pNVar4->nstops == 0) {
      memset(cache->colors,0,0x400);
    }
    if ((long)pNVar4->nstops == 1) {
      fVar17 = 1.0;
      if (opacity <= 1.0) {
        fVar17 = opacity;
      }
      lVar8 = 0;
      do {
        uVar6 = pNVar4->stops[lVar8].color;
        cache->colors[lVar8] =
             (uVar6 >> 8 & 0xff0000) *
             (int)(float)(~-(uint)(opacity < 0.0) & (uint)(fVar17 * 256.0)) & 0xff000000 |
             uVar6 & 0xffffff;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
    }
    else {
      fVar17 = 1.0;
      if (opacity <= 1.0) {
        fVar17 = opacity;
      }
      iVar7 = (int)(float)(~-(uint)(opacity < 0.0) & (uint)(fVar17 * 256.0));
      fVar17 = pNVar4->stops[0].offset;
      fVar15 = 1.0;
      if (fVar17 <= 1.0) {
        fVar15 = fVar17;
      }
      fVar15 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar15);
      fVar17 = pNVar4->stops[(long)pNVar4->nstops + -1].offset;
      if (0 < (int)(fVar15 * 255.0)) {
        uVar6 = pNVar4->stops[0].color;
        uVar11 = 0;
        do {
          cache->colors[uVar11] = (uVar6 >> 8 & 0xff0000) * iVar7 & 0xff000000 | uVar6 & 0xffffff;
          uVar11 = uVar11 + 1;
        } while ((uint)(int)(fVar15 * 255.0) != uVar11);
      }
      if (pNVar4->nstops < 2) {
        fVar16 = 1.0;
        if (fVar17 <= 1.0) {
          fVar16 = fVar17;
        }
        iVar12 = (int)((float)(~-(uint)(fVar17 < fVar15) & (uint)fVar16 |
                              -(uint)(fVar17 < fVar15) & (uint)fVar15) * 255.0);
        fVar17 = 0.0;
      }
      else {
        lVar8 = 0;
        do {
          fVar15 = pNVar4[1].xform[lVar8 * 2];
          uVar6 = ((uint)fVar15 >> 8 & 0xff0000) * iVar7;
          fVar17 = pNVar4->stops[lVar8].offset;
          fVar16 = 1.0;
          if (fVar17 <= 1.0) {
            fVar16 = fVar17;
          }
          fVar1 = pNVar4[1].stops[lVar8 + -5].offset;
          fVar18 = 1.0;
          if (fVar1 <= 1.0) {
            fVar18 = fVar1;
          }
          iVar9 = (int)(float)(~-(uint)(fVar17 < 0.0) & (uint)(fVar16 * 255.0));
          iVar12 = (int)(float)(~-(uint)(fVar1 < 0.0) & (uint)(fVar18 * 255.0));
          uVar13 = iVar12 - iVar9;
          if (uVar13 != 0 && iVar9 <= iVar12) {
            uVar3 = pNVar4->stops[lVar8].color;
            fVar17 = 0.0;
            uVar11 = 0;
            do {
              fVar16 = 1.0;
              if (fVar17 <= 1.0) {
                fVar16 = fVar17;
              }
              iVar10 = (int)(float)(~-(uint)(fVar17 < 0.0) & (uint)(fVar16 * 256.0));
              iVar14 = 0x100 - iVar10;
              cache->colors[(long)iVar9 + uVar11] =
                   (iVar10 * (uVar6 >> 0x18) + iVar14 * ((uVar3 >> 8 & 0xff0000) * iVar7 >> 0x18) &
                   0xff00) << 0x10 |
                   (((uint)fVar15 >> 0x10 & 0xff) * iVar10 + iVar14 * (uVar3 >> 0x10 & 0xff) &
                   0xff00) << 8 |
                   ((uint)fVar15 >> 8 & 0xff) * iVar10 + iVar14 * (uVar3 >> 8 & 0xff) & 0xff00 |
                   ((uint)fVar15 & 0xff) * iVar10 + iVar14 * (uVar3 & 0xff) >> 8 & 0xff;
              fVar17 = fVar17 + 1.0 / (float)(int)uVar13;
              uVar11 = uVar11 + 1;
            } while (uVar13 != uVar11);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (long)pNVar4->nstops + -1);
        fVar17 = (float)(uVar6 & 0xff000000 | (uint)fVar15 & 0xffffff);
      }
      if (iVar12 < 0x100) {
        lVar8 = (long)iVar12 + 7;
        do {
          cache->xform[lVar8 + -1] = fVar17;
          iVar7 = (int)lVar8;
          lVar8 = lVar8 + 1;
        } while (iVar7 != 0x106);
      }
    }
  }
  return;
}

Assistant:

static void nsvg__initPaint(NSVGcachedPaint* cache, NSVGpaint* paint, float opacity)
{
	int i, j;
	NSVGgradient* grad;

	cache->type = paint->type;

	if (paint->type == NSVG_PAINT_COLOR) {
		cache->colors[0] = nsvg__applyOpacity(paint->color, opacity);
		return;
	}

	grad = paint->gradient;

	cache->spread = grad->spread;
	memcpy(cache->xform, grad->xform, sizeof(float)*6);

	if (grad->nstops == 0) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = 0;
	} if (grad->nstops == 1) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = nsvg__applyOpacity(grad->stops[i].color, opacity);
	} else {
		unsigned int ca, cb = 0;
		float ua, ub, du, u;
		int ia, ib, count;

		ca = nsvg__applyOpacity(grad->stops[0].color, opacity);
		ua = nsvg__clampf(grad->stops[0].offset, 0, 1);
		ub = nsvg__clampf(grad->stops[grad->nstops-1].offset, ua, 1);
		ia = (int)(ua * 255.0f);
		ib = (int)(ub * 255.0f);
		for (i = 0; i < ia; i++) {
			cache->colors[i] = ca;
		}

		for (i = 0; i < grad->nstops-1; i++) {
			ca = nsvg__applyOpacity(grad->stops[i].color, opacity);
			cb = nsvg__applyOpacity(grad->stops[i+1].color, opacity);
			ua = nsvg__clampf(grad->stops[i].offset, 0, 1);
			ub = nsvg__clampf(grad->stops[i+1].offset, 0, 1);
			ia = (int)(ua * 255.0f);
			ib = (int)(ub * 255.0f);
			count = ib - ia;
			if (count <= 0) continue;
			u = 0;
			du = 1.0f / (float)count;
			for (j = 0; j < count; j++) {
				cache->colors[ia+j] = nsvg__lerpRGBA(ca,cb,u);
				u += du;
			}
		}

		for (i = ib; i < 256; i++)
			cache->colors[i] = cb;
	}

}